

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
__thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
          *node)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  pointer puVar4;
  _Head_base<0UL,_verilogAST::StringBodyModule_*,_false> _Var5;
  long *in_RDX;
  pointer *__ptr;
  __index_type *p_Var6;
  undefined8 *puVar7;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  new_ports;
  long *local_a8;
  long *local_a0;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  local_98;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  local_78;
  long *local_60;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_58;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  *local_48;
  _Head_base<0UL,_verilogAST::StringBodyModule_*,_false> local_40;
  undefined1 *local_38;
  
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar7 = *(undefined8 **)(*in_RDX + 0x28);
  puVar1 = *(undefined8 **)(*in_RDX + 0x30);
  local_60 = in_RDX;
  local_40._M_head_impl = (StringBodyModule *)this;
  if (puVar7 != puVar1) {
    do {
      local_a0 = (long *)*puVar7;
      *puVar7 = 0;
      (**(code **)&(node->_M_t).
                   super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                   .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl[2].
                   super_Module)(&local_98,node,&local_a0);
      std::
      vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
      ::
      emplace_back<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>
                ((vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
                  *)&local_78,
                 (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                  *)&local_98);
      if (local_98.
          super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((local_98.
                    super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::AbstractPort_*,_std::default_delete<verilogAST::AbstractPort>_>
                  .super__Head_base<0UL,_verilogAST::AbstractPort_*,_false>._M_head_impl[2].
                  super_Node._vptr_Node)();
      }
      local_98.
      super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_a0 != (long *)0x0) {
        (**(code **)(*local_a0 + 0x10))();
      }
      local_a0 = (long *)0x0;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  plVar3 = local_60;
  lVar2 = *local_60;
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar2 + 0x28);
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar2 + 0x30);
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar2 + 0x38);
  *(pointer *)(lVar2 + 0x28) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(lVar2 + 0x30) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(lVar2 + 0x38) =
       local_78.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector(&local_98);
  p_Var6 = *(__index_type **)(*plVar3 + 0x58);
  local_38 = *(undefined1 **)(*plVar3 + 0x60);
  if (p_Var6 != local_38) {
    do {
      local_58.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = p_Var6[8];
      local_48 = &local_58;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&&>
        ::_S_vtable._M_arr[p_Var6[8]]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_48,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)p_Var6);
      (*(code *)(((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                  .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl)->body)
                .field_2._M_allocated_capacity)(&local_98,node,&local_58);
      local_48 = (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)p_Var6;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr
        [(ulong)local_98.
                super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 0xff]._M_data)
                ((anon_class_8_1_8991fb9c_conflict1 *)&local_48,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_98);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr
        [(ulong)local_98.
                super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)&local_48,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_98);
      local_98.
      super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(local_98.
                             super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,0xff);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr
        [local_58.
         super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_48,&local_58);
      local_58.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = 0xff;
      local_a8 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                               *)(p_Var6 + 0x10))->
                            super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                            ).
                            super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ;
      *(undefined8 *)
       &(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           *)(p_Var6 + 0x10))->
        super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
        ).
        super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
           = 0;
      (**(code **)&((node->_M_t).
                    super___uniq_ptr_impl<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::StringBodyModule_*,_std::default_delete<verilogAST::StringBodyModule>_>
                    .super__Head_base<0UL,_verilogAST::StringBodyModule_*,_false>._M_head_impl)->
                   super_Module)(&local_98,node,&local_a8);
      puVar4 = local_98.
               super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_98.
      super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      plVar3 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                             *)(p_Var6 + 0x10))->
                          super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                          ).
                          super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ;
      *(pointer *)
       &(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           *)(p_Var6 + 0x10))->
        super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
        ).
        super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
           = puVar4;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x10))();
      }
      if (local_98.
          super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((local_98.
                    super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::AbstractPort_*,_std::default_delete<verilogAST::AbstractPort>_>
                  .super__Head_base<0UL,_verilogAST::AbstractPort_*,_false>._M_head_impl[2].
                  super_Node._vptr_Node)();
      }
      local_98.
      super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_a8 != (long *)0x0) {
        (**(code **)(*local_a8 + 0x10))();
      }
      local_a8 = (long *)0x0;
      p_Var6 = p_Var6 + 0x18;
    } while (p_Var6 != local_38);
  }
  _Var5._M_head_impl = local_40._M_head_impl;
  *(long *)&(local_40._M_head_impl)->super_Module = *local_60;
  *local_60 = 0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector(&local_78);
  return (__uniq_ptr_data<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>,_true,_true>
          )(__uniq_ptr_data<verilogAST::StringBodyModule,_std::default_delete<verilogAST::StringBodyModule>,_true,_true>
            )_Var5._M_head_impl;
}

Assistant:

std::unique_ptr<StringBodyModule> Transformer::visit(
    std::unique_ptr<StringBodyModule> node) {
  std::vector<std::unique_ptr<AbstractPort>> new_ports;
  for (auto&& item : node->ports) {
    new_ports.push_back(this->visit(std::move(item)));
  }
  node->ports = std::move(new_ports);
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  return node;
}